

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.hpp
# Opt level: O1

uint8_t plot::ansi::detail::find_color256(Color c)

{
  bool bVar1;
  uint8_t uVar2;
  Color32 CVar3;
  pair<plot::Color,_std::pair<int,_bool>_> *ppVar4;
  long lVar5;
  pair<plot::Color,_std::pair<int,_bool>_> *__it2;
  float in_XMM0_Da;
  float fVar6;
  float in_XMM0_Db;
  float in_XMM1_Da;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  Color local_58;
  int local_44;
  undefined1 local_40 [16];
  
  lVar5 = 0x18;
  __it2 = (pair<plot::Color,_std::pair<int,_bool>_> *)&palette;
  local_58.r = in_XMM0_Da;
  local_58.g = in_XMM0_Db;
  local_58.b = in_XMM1_Da;
  do {
    bVar1 = __gnu_cxx::__ops::
            _Iter_comp_iter<plot::ansi::detail::find_palette_entry(plot::Color)::{lambda(auto:1_const&,auto:2_const&)#1}>
            ::operator()(local_40,(pair<plot::Color,_std::pair<int,_bool>_> *)
                                  ((long)&palette + lVar5),__it2);
    ppVar4 = (pair<plot::Color,_std::pair<int,_bool>_> *)((long)&palette + lVar5);
    if (!bVar1) {
      ppVar4 = __it2;
    }
    lVar5 = lVar5 + 0x18;
    __it2 = ppVar4;
  } while (lVar5 != 0x180);
  fVar6 = (ppVar4->first).r;
  local_44 = (ppVar4->second).first;
  bVar1 = (ppVar4->second).second;
  CVar3 = Color::color32(&local_58,'\x05',0xff);
  fVar7 = local_58.b * 0.11 + local_58.r * 0.3 + local_58.g * 0.59;
  fVar7 = (float)(-(uint)(0.0 <= fVar7) & (uint)fVar7);
  if (1.0 <= fVar7) {
    fVar7 = 1.0;
  }
  lVar5 = lroundf(fVar7 * 23.0);
  fVar8 = (fVar6 + local_58.r) * 0.5;
  fVar7 = local_58.g - (ppVar4->first).g;
  fVar6 = local_58.r - fVar6;
  fVar9 = local_58.b - (ppVar4->first).b;
  fVar6 = (3.0 - fVar8) * fVar9 * fVar9 + (fVar8 + 2.0) * fVar6 * fVar6 + fVar7 * 4.0 * fVar7;
  if (fVar6 < 0.0) {
    fVar6 = sqrtf(fVar6);
  }
  else {
    fVar6 = SQRT(fVar6);
  }
  fVar7 = (float)((uint)CVar3 & 0xff) / 5.0;
  fVar9 = local_58.g - (float)((uint)CVar3 >> 8 & 0xff) / 5.0;
  fVar8 = (fVar7 + local_58.r) * 0.5;
  fVar7 = local_58.r - fVar7;
  fVar10 = local_58.b - (float)((uint)CVar3 >> 0x10 & 0xff) / 5.0;
  fVar7 = (3.0 - fVar8) * fVar10 * fVar10 + (fVar8 + 2.0) * fVar7 * fVar7 + fVar9 * 4.0 * fVar9;
  if (fVar7 < 0.0) {
    fVar7 = sqrtf(fVar7);
  }
  else {
    fVar7 = SQRT(fVar7);
  }
  fVar8 = (float)((uint)lVar5 & 0xff) / 23.0;
  fVar9 = (fVar8 + local_58.r) * 0.5;
  local_58.b = local_58.b - (float)((uint)lVar5 & 0xff) / 23.0;
  fVar8 = (3.0 - fVar9) * local_58.b * local_58.b +
          (fVar9 + 2.0) * (local_58.r - fVar8) * (local_58.r - fVar8) +
          (local_58.g - fVar8) * 4.0 * (local_58.g - fVar8);
  if (fVar8 < 0.0) {
    fVar8 = sqrtf(fVar8);
  }
  else {
    fVar8 = SQRT(fVar8);
  }
  if ((fVar6 < fVar7) || (fVar8 < fVar7)) {
    if (fVar8 <= fVar6) {
      uVar2 = (char)lVar5 + 0xe8;
    }
    else {
      uVar2 = (char)local_44 + bVar1 * '\b';
    }
  }
  else {
    uVar2 = CVar3.b + CVar3.r * '$' + CVar3.g * '\x06' + '\x10';
  }
  return uVar2;
}

Assistant:

inline std::uint8_t find_color256(plot::Color c) {
            using utils::clamp;
            auto ansi_clr = find_palette_entry(c);
            auto color = c.color32(5);
            std::uint8_t gray = std::lround(clamp(0.3f*c.r + 0.59f*c.g + 0.11f*c.b, 0.0f, 1.0f)*23);

            auto ansi_dist = ansi_clr.first.distance(c);
            auto color_dist = plot::Color(color, 5).distance(c);
            auto gray_dist = plot::Color({ gray, gray, gray, 255 }, 23).distance(c);

            if (color_dist <= gray_dist && color_dist <= ansi_dist) {
                return 16 + 36*color.r + 6*color.g + color.b;
            } else if (gray_dist <= ansi_dist) {
                return gray + 0xe8;
            } else {
                return ansi_clr.second.first + 8*ansi_clr.second.second;
            }
        }